

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void aggregateConvertIndexedExprRefToColumn(AggInfo *pAggInfo)

{
  Walker *in_RDI;
  long in_FS_OFFSET;
  int i;
  Walker w;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar1;
  undefined1 local_38 [8];
  code *local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0xaa,0x30);
  memset(local_38,0,0x30);
  local_30 = aggregateIdxEprRefToColCallback;
  for (iVar1 = 0; iVar1 < *(int *)&in_RDI[1].pParse; iVar1 = iVar1 + 1) {
    sqlite3WalkExpr(in_RDI,(Expr *)CONCAT44(iVar1,in_stack_ffffffffffffffb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void aggregateConvertIndexedExprRefToColumn(AggInfo *pAggInfo){
  int i;
  Walker w;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = aggregateIdxEprRefToColCallback;
  for(i=0; i<pAggInfo->nFunc; i++){
    sqlite3WalkExpr(&w, pAggInfo->aFunc[i].pFExpr);
  }
}